

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre_test.cc
# Opt level: O2

void __thiscall
TrivialRETest_Runnings_Test::~TrivialRETest_Runnings_Test(TrivialRETest_Runnings_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TrivialRETest, Runnings) {
  // Format is {re, example...}. Each example is prefixed with '+' for
  // must match or '-' for must not.
  std::vector<std::vector<std::string_view>> cases2 = {
      {"a*", "+a", "+", "+not"},
      {"aa*", "+a", "+aaa", "+ba", "-b"},
      {"a+", "+a", "+aa", "+aaa", "-", "-b"},
      {".", "-\n", "+a", "-"},

      {"[a-f]", "+a", "-z", "-", "+f", "--"},
      {"[a-f-]", "+a", "-z", "-", "+f", "+-"},
      {"[az]", "+a", "-b", "+z"},
      {"[^a-f]", "-a", "+z", "-", "-f"},
      {"[^a-f-]", "-a", "+z", "-", "-f", "--"},
      {"[a-f0-9]", "+a", "-z", "+0", "+9"},
      {"[^]", "+a", "+\n"},
      {"", "+", "+asdasd"},

      {"a(b|c+)d", "+abd", "-ab", "-abcd", "+accd", "-ad"},
      {"a(b|c+)?d", "+abd", "-ab", "-abcd", "+accd", "+ad"},

      {"^a", "+a", "-ba", "+b\na"},
      {"a$", "+a\nb", "+ba", "+b\na"},
      {"a$\\nb", "+a\nb"},
      {"$", "+", "+aaa"},
      {"^$", "+", "-aaa", "+aaa\n"},
  };

  for (const auto& vec : cases2) {
    Matcher m = CompileREOrDie(vec[0]);
    printf("testing /%s/ re: %s\n", std::string(vec[0]).c_str(),
           trivialre::re_compiler::C<StringTestingBuilder>({}).CompileOrDie(vec[0])
               .c_str());
    for (size_t i = 1; i < vec.size(); i++) {
      std::string_view s = vec[i];
      printf("trying: %.*s\n", int(s.size()), s.data());
      if (s[0] == '+') {
        EXPECT_TRUE(MatchSubstring(m, s.substr(1))) << "re: " << vec[0] << " s: " << s;
      } else {
        assert(s[0] == '-');
        EXPECT_FALSE(MatchSubstring(m, s.substr(1))) << "re: " << vec[0] << " s: " << s;
      }
    }
  }
}